

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

_Bool ggml_backend_sched_alloc_graph(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  ggml_cgraph *graph_00;
  _func_void_ggml_backend_t *p_Var1;
  bool bVar2;
  _Bool _Var3;
  long lVar4;
  long lVar5;
  
  if ((int)(sched->hash_set).size < graph->n_leafs + graph->n_nodes) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-backend.cpp"
               ,0x617,"GGML_ASSERT(%s) failed",
               "(int)sched->hash_set.size >= graph->n_nodes + graph->n_leafs");
  }
  ggml_backend_sched_split_graph(sched,graph);
  lVar4 = (long)(sched->graph).n_nodes;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      if ((sched->node_backend_ids[lVar5] != sched->prev_node_backend_ids[lVar5]) &&
         (sched->bufts[sched->node_backend_ids[lVar5]] !=
          sched->bufts[sched->prev_node_backend_ids[lVar5]])) {
        bVar2 = true;
        goto LAB_0012791b;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  bVar2 = false;
LAB_0012791b:
  if ((!bVar2) && (lVar4 = (long)(sched->graph).n_leafs, 0 < lVar4)) {
    lVar5 = 0;
    do {
      if ((sched->leaf_backend_ids[lVar5] != sched->prev_leaf_backend_ids[lVar5]) &&
         (sched->bufts[sched->leaf_backend_ids[lVar5]] !=
          sched->bufts[sched->prev_leaf_backend_ids[lVar5]])) {
        bVar2 = true;
        break;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  graph_00 = &sched->graph;
  if (!bVar2) {
    _Var3 = ggml_gallocr_alloc_graph(sched->galloc,graph_00);
    bVar2 = true;
    if (_Var3) goto LAB_001279fb;
  }
  if (0 < sched->n_backends) {
    lVar4 = 0;
    do {
      p_Var1 = (sched->backends[lVar4]->iface).synchronize;
      if (p_Var1 != (_func_void_ggml_backend_t *)0x0) {
        (*p_Var1)(sched->backends[lVar4]);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < sched->n_backends);
  }
  ggml_gallocr_reserve_n(sched->galloc,graph_00,sched->node_backend_ids,sched->leaf_backend_ids);
  _Var3 = ggml_gallocr_alloc_graph(sched->galloc,graph_00);
  bVar2 = true;
  if (!_Var3) {
    bVar2 = false;
    ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate graph\n",
                      "ggml_backend_sched_alloc_splits");
  }
LAB_001279fb:
  if (bVar2) {
    sched->is_alloc = true;
  }
  return bVar2;
}

Assistant:

bool ggml_backend_sched_alloc_graph(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    GGML_ASSERT((int)sched->hash_set.size >= graph->n_nodes + graph->n_leafs);

    ggml_backend_sched_split_graph(sched, graph);


    if (!ggml_backend_sched_alloc_splits(sched)) {
        return false;
    }

    sched->is_alloc = true;

    return true;
}